

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O0

void xx(int line_no,int n,char **ps,char *s,int from,int to,int mem,int not,int error_no)

{
  int iVar1;
  size_t sVar2;
  char local_498 [4];
  int len;
  char buf_1 [1000];
  OnigRegion *region;
  char buf [90];
  char *end;
  OnigRegSet *set;
  undefined1 local_30 [4];
  int match_index;
  int match_pos;
  int r;
  int to_local;
  int from_local;
  char *s_local;
  char **ps_local;
  int n_local;
  int line_no_local;
  
  match_pos = to;
  r = from;
  _to_local = s;
  s_local = (char *)ps;
  ps_local._0_4_ = n;
  ps_local._4_4_ = line_no;
  match_index = make_regset(line_no,n,ps,(OnigRegSet **)&end,error_no);
  unique0x100001fa = _to_local;
  if (match_index == 0) {
    sVar2 = strlen(_to_local);
    register0x00000000 = unique0x100001fa + sVar2;
    match_index = onig_regset_search(end,_to_local,register0x00000000,_to_local,register0x00000000,
                                     XX_LEAD,0,local_30);
    if (match_index < 0) {
      if (match_index == 0xffffffff) {
        if (not == 0) {
          fprintf(_stdout,"FAIL: %d\n",(ulong)ps_local._4_4_);
          nfail = nfail + 1;
        }
        else {
          fprintf(_stdout,"OK(N): %d\n",(ulong)ps_local._4_4_);
          nsucc = nsucc + 1;
        }
      }
      else if (error_no == 0) {
        onig_error_code_to_str(&region,match_index);
        fprintf(_stderr,"ERROR: %d: %s\n",(ulong)ps_local._4_4_,&region);
        nerror = nerror + 1;
      }
      else if (match_index == error_no) {
        fprintf(_stdout,"OK(ERROR): %d: %d\n",(ulong)ps_local._4_4_,(ulong)(uint)match_index);
        nsucc = nsucc + 1;
      }
      else {
        fprintf(_stdout,"FAIL ERROR NO: %d: %d, %d\n",(ulong)ps_local._4_4_,(ulong)(uint)error_no,
                (ulong)(uint)match_index);
        nfail = nfail + 1;
      }
    }
    else if (not == 0) {
      set._4_4_ = match_index;
      buf_1._992_8_ = onig_regset_get_region(end,match_index);
      if (buf_1._992_8_ == 0) {
        fprintf(_stderr,"ERROR: %d: can\'t get region.\n",(ulong)ps_local._4_4_);
        nerror = nerror + 1;
        onig_regset_free(end);
        return;
      }
      if ((*(int *)(*(long *)(buf_1._992_8_ + 8) + (long)mem * 4) == r) &&
         (*(int *)(*(long *)(buf_1._992_8_ + 0x10) + (long)mem * 4) == match_pos)) {
        fprintf(_stdout,"OK: %d\n",(ulong)ps_local._4_4_);
        nsucc = nsucc + 1;
      }
      else {
        iVar1 = *(int *)(*(long *)(buf_1._992_8_ + 0x10) + (long)mem * 4) -
                *(int *)(*(long *)(buf_1._992_8_ + 8) + (long)mem * 4);
        strncpy(local_498,_to_local + *(int *)(*(long *)(buf_1._992_8_ + 8) + (long)mem * 4),
                (long)iVar1);
        local_498[iVar1] = '\0';
        fprintf(_stdout,"FAIL: %d: %d-%d : %d-%d (%s)\n",(ulong)ps_local._4_4_,(ulong)(uint)r,
                (ulong)(uint)match_pos,
                (ulong)*(uint *)(*(long *)(buf_1._992_8_ + 8) + (long)mem * 4),
                *(undefined4 *)(*(long *)(buf_1._992_8_ + 0x10) + (long)mem * 4),local_498);
        nfail = nfail + 1;
      }
    }
    else {
      fprintf(_stdout,"FAIL(N): %d\n",(ulong)ps_local._4_4_);
      nfail = nfail + 1;
    }
    onig_regset_free(end);
  }
  return;
}

Assistant:

static void
xx(int line_no, int n, char* ps[], char* s, int from, int to, int mem, int not, int error_no)
{
  int r;
  int match_pos;
  int match_index;
  OnigRegSet* set;
  char *end;

  r = make_regset(line_no, n, ps, &set, error_no);
  if (r != 0) return ;

  end = s + strlen(s);

  r = onig_regset_search(set, (UChar* )s, (UChar* )end, (UChar* )s, (UChar* )end,
                         XX_LEAD, ONIG_OPTION_NONE, &match_pos);
  if (r < 0) {
    if (r == ONIG_MISMATCH) {
      if (not) {
        fprintf(stdout, "OK(N): %d\n", line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL: %d\n", line_no);
        nfail++;
      }
    }
    else {
      if (error_no == 0) {
        char buf[ONIG_MAX_ERROR_MESSAGE_LEN];
        onig_error_code_to_str((UChar* )buf, r);
        fprintf(stderr, "ERROR: %d: %s\n", line_no, buf);
        nerror++;
      }
      else {
        if (r == error_no) {
          fprintf(stdout, "OK(ERROR): %d: %d\n", line_no, r);
          nsucc++;
        }
        else {
          fprintf(stdout, "FAIL ERROR NO: %d: %d, %d\n", line_no, error_no, r);
          nfail++;
        }
      }
    }
  }
  else {
    if (not) {
      fprintf(stdout, "FAIL(N): %d\n", line_no);
      nfail++;
    }
    else {
      OnigRegion* region;

      match_index = r;
      region = onig_regset_get_region(set, match_index);
      if (region == 0) {
        fprintf(stderr, "ERROR: %d: can't get region.\n", line_no);
        nerror++;
        onig_regset_free(set);
        return ;
      }

      if (region->beg[mem] == from && region->end[mem] == to) {
        fprintf(stdout, "OK: %d\n", line_no);
        nsucc++;
      }
      else {
        char buf[1000];
        int len;
        len = region->end[mem] - region->beg[mem];
        strncpy(buf, s + region->beg[mem], len);
        buf[len] = '\0';
        fprintf(stdout, "FAIL: %d: %d-%d : %d-%d (%s)\n", line_no,
                from, to, region->beg[mem], region->end[mem], buf);
        nfail++;
      }
    }
  }

  onig_regset_free(set);
}